

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O0

void __thiscall
FNodeBuilder::Extract
          (FNodeBuilder *this,node_t **outNodes,int *nodeCount,seg_t **outSegs,
          glsegextra_t **outSegExtras,int *segCount,subsector_t **outSubs,int *subCount,
          vertex_t **outVerts,int *vertCount)

{
  fixed_t x;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  vertex_t *pvVar8;
  side_t *psVar9;
  line_t *plVar10;
  sector_t *psVar11;
  sector_t *psVar12;
  undefined4 uVar13;
  uint uVar14;
  DWORD DVar15;
  ulong uVar16;
  ulong uVar17;
  vertex_t *pvVar18;
  FPrivVert *pFVar19;
  subsector_t *psVar20;
  node_t *pnVar21;
  node_t *__src;
  seg_t *psVar22;
  glsegextra_t *pgVar23;
  glseg_t *pgVar24;
  FPrivSeg *pFVar25;
  subsector_t *__src_00;
  USegPtr *pUVar26;
  long lVar27;
  vertex_t *local_a8;
  seg_t *out;
  FPrivSeg *org;
  undefined1 local_68 [4];
  DWORD numsegs;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> segs;
  int k;
  int j_1;
  int j;
  int local_3c;
  int i;
  int *segCount_local;
  glsegextra_t **outSegExtras_local;
  seg_t **outSegs_local;
  int *nodeCount_local;
  node_t **outNodes_local;
  FNodeBuilder *this_local;
  
  uVar14 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Size(&this->Vertices);
  *vertCount = uVar14;
  uVar16 = (ulong)*vertCount;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar16;
  uVar17 = SUB168(auVar1 * ZEXT816(0x38),0);
  if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = (vertex_t *)operator_new__(uVar17);
  if (uVar16 != 0) {
    local_a8 = pvVar18;
    do {
      vertex_t::vertex_t(local_a8);
      local_a8 = local_a8 + 1;
    } while (local_a8 != pvVar18 + uVar16);
  }
  *outVerts = pvVar18;
  for (local_3c = 0; local_3c < *vertCount; local_3c = local_3c + 1) {
    pvVar18 = *outVerts;
    pFVar19 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                        (&this->Vertices,(long)local_3c);
    x = (pFVar19->super_FSimpleVert).x;
    pFVar19 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                        (&this->Vertices,(long)local_3c);
    vertex_t::set(pvVar18 + local_3c,x,(pFVar19->super_FSimpleVert).y);
  }
  uVar14 = TArray<subsector_t,_subsector_t>::Size(&this->Subsectors);
  *subCount = uVar14;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*subCount;
  uVar16 = SUB168(auVar2 * ZEXT816(0x60),0);
  if (SUB168(auVar2 * ZEXT816(0x60),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  psVar20 = (subsector_t *)operator_new__(uVar16);
  *outSubs = psVar20;
  memset(*outSubs,0,(long)*subCount * 0x60);
  uVar14 = TArray<node_t,_node_t>::Size(&this->Nodes);
  *nodeCount = uVar14;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)*nodeCount;
  uVar16 = SUB168(auVar3 * ZEXT816(0x48),0);
  if (SUB168(auVar3 * ZEXT816(0x48),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pnVar21 = (node_t *)operator_new__(uVar16);
  *outNodes = pnVar21;
  pnVar21 = *outNodes;
  __src = TArray<node_t,_node_t>::operator[](&this->Nodes,0);
  memcpy(pnVar21,__src,(long)*nodeCount * 0x48);
  for (local_3c = 0; local_3c < *nodeCount; local_3c = local_3c + 1) {
    for (k = 1; -1 < k; k = k + -1) {
      if (((*outNodes)[local_3c].field_6.intchildren[k] & 0x80000000U) == 0) {
        (*outNodes)[local_3c].field_6.children[k] =
             *outNodes + (*outNodes)[local_3c].field_6.intchildren[k];
      }
      else {
        (*outNodes)[local_3c].field_6.children[k] =
             (void *)((long)&(*outSubs)
                             [(int)((*outNodes)[local_3c].field_6.intchildren[k] & 0x7fffffff)].
                             sector + 1);
      }
    }
    for (segs.Count = 0; (int)segs.Count < 2; segs.Count = segs.Count + 1) {
      for (segs.Most = 0; (int)segs.Most < 4; segs.Most = segs.Most + 1) {
        dVar7 = FixedToFloat(*(fixed_t *)
                              ((long)&(*outNodes)[local_3c].field_4 +
                              (long)(int)segs.Most * 4 + (long)(int)segs.Count * 0x10));
        *(float *)((long)&(*outNodes)[local_3c].field_4 +
                  (long)(int)segs.Most * 4 + (long)(int)segs.Count * 0x10) = (float)dVar7;
      }
    }
  }
  if ((this->GLNodes & 1U) == 0) {
    psVar20 = *outSubs;
    __src_00 = TArray<subsector_t,_subsector_t>::operator[](&this->Subsectors,0);
    memcpy(psVar20,__src_00,(long)*subCount * 0x60);
    uVar14 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
    *segCount = uVar14;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)*segCount;
    uVar16 = SUB168(auVar6 * ZEXT816(0x48),0);
    if (SUB168(auVar6 * ZEXT816(0x48),8) != 0) {
      uVar16 = 0xffffffffffffffff;
    }
    psVar22 = (seg_t *)operator_new__(uVar16);
    *outSegs = psVar22;
    *outSegExtras = (glsegextra_t *)0x0;
    for (local_3c = 0; local_3c < *segCount; local_3c = local_3c + 1) {
      pUVar26 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                          (&this->SegList,(long)local_3c);
      pFVar25 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                          (&this->Segs,(ulong)pUVar26->SegNum);
      psVar22 = *outSegs + local_3c;
      psVar22->v1 = *outVerts + pFVar25->v1;
      psVar22->v2 = *outVerts + pFVar25->v2;
      psVar22->backsector = pFVar25->backsector;
      psVar22->frontsector = pFVar25->frontsector;
      psVar22->linedef = this->Level->Lines + pFVar25->linedef;
      psVar22->sidedef = this->Level->Sides + pFVar25->sidedef;
    }
  }
  else {
    uVar14 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::TArray
              ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_68,uVar14 * 5 >> 2);
    for (local_3c = 0; local_3c < *subCount; local_3c = local_3c + 1) {
      DVar15 = CloseSubsector(this,(TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_68,
                              local_3c,*outVerts);
      (*outSubs)[local_3c].numlines = DVar15;
      uVar14 = TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Size
                         ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_68);
      (*outSubs)[local_3c].firstline = (seg_t *)(ulong)(uVar14 - DVar15);
    }
    uVar14 = TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Size
                       ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_68);
    *segCount = uVar14;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)*segCount;
    uVar16 = SUB168(auVar4 * ZEXT816(0x48),0);
    if (SUB168(auVar4 * ZEXT816(0x48),8) != 0) {
      uVar16 = 0xffffffffffffffff;
    }
    psVar22 = (seg_t *)operator_new__(uVar16);
    *outSegs = psVar22;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)*segCount;
    uVar16 = SUB168(auVar5 * ZEXT816(0x10),0);
    if (SUB168(auVar5 * ZEXT816(0x10),8) != 0) {
      uVar16 = 0xffffffffffffffff;
    }
    pgVar23 = (glsegextra_t *)operator_new__(uVar16);
    *outSegExtras = pgVar23;
    for (local_3c = 0; local_3c < *segCount; local_3c = local_3c + 1) {
      pgVar24 = TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::operator[]
                          ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_68,
                           (long)local_3c);
      psVar22 = *outSegs;
      lVar27 = (long)local_3c;
      uVar13 = *(undefined4 *)&(pgVar24->super_seg_t).field_0x44;
      psVar22[lVar27].sidefrac = (pgVar24->super_seg_t).sidefrac;
      *(undefined4 *)&psVar22[lVar27].field_0x44 = uVar13;
      pvVar18 = (pgVar24->super_seg_t).v1;
      pvVar8 = (pgVar24->super_seg_t).v2;
      psVar9 = (pgVar24->super_seg_t).sidedef;
      plVar10 = (pgVar24->super_seg_t).linedef;
      psVar11 = (pgVar24->super_seg_t).frontsector;
      psVar12 = (pgVar24->super_seg_t).backsector;
      psVar20 = (pgVar24->super_seg_t).Subsector;
      psVar22[lVar27].PartnerSeg = (pgVar24->super_seg_t).PartnerSeg;
      (&psVar22[lVar27].PartnerSeg)[1] = (seg_t *)psVar20;
      psVar22[lVar27].frontsector = psVar11;
      (&psVar22[lVar27].frontsector)[1] = psVar12;
      psVar22[lVar27].sidedef = psVar9;
      (&psVar22[lVar27].sidedef)[1] = (side_t *)plVar10;
      psVar22[lVar27].v1 = pvVar18;
      psVar22[lVar27].v2 = pvVar8;
      pgVar24 = TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::operator[]
                          ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_68,
                           (long)local_3c);
      if (pgVar24->Partner == 0xffffffff) {
        (*outSegExtras)[local_3c].PartnerSeg = 0xffffffff;
      }
      else {
        pgVar24 = TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::operator[]
                            ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_68,
                             (long)local_3c);
        pFVar25 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                            (&this->Segs,(ulong)pgVar24->Partner);
        (*outSegExtras)[local_3c].PartnerSeg = pFVar25->storedseg;
      }
    }
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::~TArray
              ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_68);
  }
  for (local_3c = 0; local_3c < *subCount; local_3c = local_3c + 1) {
    (*outSubs)[local_3c].firstline = *outSegs + (long)(*outSubs)[local_3c].firstline;
  }
  for (local_3c = 0; local_3c < this->Level->NumLines; local_3c = local_3c + 1) {
    this->Level->Lines[local_3c].v1 = *outVerts + (long)this->Level->Lines[local_3c].v1;
    this->Level->Lines[local_3c].v2 = *outVerts + (long)this->Level->Lines[local_3c].v2;
  }
  return;
}

Assistant:

void FNodeBuilder::Extract (node_t *&outNodes, int &nodeCount,
	seg_t *&outSegs, glsegextra_t *&outSegExtras, int &segCount,
	subsector_t *&outSubs, int &subCount,
	vertex_t *&outVerts, int &vertCount)
{
	int i;

	vertCount = Vertices.Size ();
	outVerts = new vertex_t[vertCount];

	for (i = 0; i < vertCount; ++i)
	{
		outVerts[i].set(Vertices[i].x, Vertices[i].y);
	}

	subCount = Subsectors.Size();
	outSubs = new subsector_t[subCount];
	memset(outSubs, 0, subCount * sizeof(subsector_t));

	nodeCount = Nodes.Size ();
	outNodes = new node_t[nodeCount];

	memcpy (outNodes, &Nodes[0], nodeCount*sizeof(node_t));
	for (i = 0; i < nodeCount; ++i)
	{
		D(Printf(PRINT_LOG, "Node %d:  Splitter[%08x,%08x] [%08x,%08x]\n", i,
			outNodes[i].x, outNodes[i].y, outNodes[i].dx, outNodes[i].dy));
		// Go backwards because on 64-bit systems, both of the intchildren are
		// inside the first in-game child.
		for (int j = 1; j >= 0; --j)
		{
			if (outNodes[i].intchildren[j] & 0x80000000)
			{
				D(Printf(PRINT_LOG, "  subsector %d\n", outNodes[i].intchildren[j] & 0x7FFFFFFF));
				outNodes[i].children[j] = (BYTE *)(outSubs + (outNodes[i].intchildren[j] & 0x7fffffff)) + 1;
			}
			else
			{
				D(Printf(PRINT_LOG, "  node %d\n", outNodes[i].intchildren[j]));
				outNodes[i].children[j] = outNodes + outNodes[i].intchildren[j];
			}
		}
		for (int j = 0; j < 2; ++j)
		{
			for (int k = 0; k < 4; ++k)
			{
				outNodes[i].bbox[j][k] = FIXED2FLOAT(outNodes[i].nb_bbox[j][k]);
			}
		}
	}

	if (GLNodes)
	{
		TArray<glseg_t> segs (Segs.Size()*5/4);

		for (i = 0; i < subCount; ++i)
		{
			DWORD numsegs = CloseSubsector (segs, i, outVerts);
			outSubs[i].numlines = numsegs;
			outSubs[i].firstline = (seg_t *)(size_t)(segs.Size() - numsegs);
		}

		segCount = segs.Size ();
		outSegs = new seg_t[segCount];
		outSegExtras = new glsegextra_t[segCount];

		for (i = 0; i < segCount; ++i)
		{
			outSegs[i] = *(seg_t *)&segs[i];

			if (segs[i].Partner != DWORD_MAX)
			{
				outSegExtras[i].PartnerSeg = Segs[segs[i].Partner].storedseg;
			}
			else
			{
				outSegExtras[i].PartnerSeg = DWORD_MAX;
			}
		}
	}
	else
	{
		memcpy (outSubs, &Subsectors[0], subCount*sizeof(subsector_t));
		segCount = Segs.Size ();
		outSegs = new seg_t[segCount];
		outSegExtras = NULL;
		for (i = 0; i < segCount; ++i)
		{
			const FPrivSeg *org = &Segs[SegList[i].SegNum];
			seg_t *out = &outSegs[i];

			D(Printf(PRINT_LOG, "Seg %d: v1(%d) -> v2(%d)\n", i, org->v1, org->v2));

			out->v1 = outVerts + org->v1;
			out->v2 = outVerts + org->v2;
			out->backsector = org->backsector;
			out->frontsector = org->frontsector;
			out->linedef = Level.Lines + org->linedef;
			out->sidedef = Level.Sides + org->sidedef;
		}
	}
	for (i = 0; i < subCount; ++i)
	{
		outSubs[i].firstline = &outSegs[(size_t)outSubs[i].firstline];
	}

	D(Printf("%i segs, %i nodes, %i subsectors\n", segCount, nodeCount, subCount));

	for (i = 0; i < Level.NumLines; ++i)
	{
		Level.Lines[i].v1 = outVerts + (size_t)Level.Lines[i].v1;
		Level.Lines[i].v2 = outVerts + (size_t)Level.Lines[i].v2;
	}
}